

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

bool __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::edgeExists
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t a,size_t b)

{
  pointer pmVar1;
  const_iterator cVar2;
  bool bVar3;
  size_t local_18;
  
  pmVar1 = (this->vertices_).
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pmVar1[a]._M_t._M_impl.super__Rb_tree_header + 0x20) == 0) {
    bVar3 = false;
  }
  else {
    local_18 = b;
    cVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ::find(&pmVar1[a]._M_t,&local_18);
    bVar3 = cVar2._M_node !=
            &(this->vertices_).
             super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[a]._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  }
  return bVar3;
}

Assistant:

inline bool edgeExists(size_t a, size_t b) const
    {
        return !vertices_[a].empty() &&
               vertices_[a].find(b) != vertices_[a].end();
    }